

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

bool jsonip::parse<A>(A *t,char *str,size_t size)

{
  bool bVar1;
  undefined1 local_90 [8];
  Reader reader;
  state st;
  semantic_state ss;
  
  st.ss_ = (semantic_state *)detail::calculate_helper<A>::instance();
  reader.len_ = (size_t)t;
  semantic_state::semantic_state((semantic_state *)&st.line_,(state_t *)&reader.len_);
  st.ss_ = (semantic_state *)local_90;
  st.reader_ = (Reader *)0x0;
  st.stack_.
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  st.stack_.
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  st.max_pos_ = (PositionType)0x1;
  local_90 = (undefined1  [8])str;
  reader.buf_ = str;
  reader.pos_ = (PositionType)size;
  reader.len_ = (size_t)&st.line_;
  st.stack_.
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)str;
  bVar1 = parser::
          or_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::grammar::atom,jsonip::grammar::spaces_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::identity<true>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                    ((ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *)&reader.len_);
  if (st.reader_ != (Reader *)0x0) {
    operator_delete(st.reader_,
                    (long)st.stack_.
                          super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)st.reader_);
  }
  if (st.line_ != 0) {
    operator_delete((void *)st.line_,
                    (long)ss.state.
                          super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - st.line_);
  }
  return bVar1;
}

Assistant:

bool parse(T& t, const char* str, size_t size)
    {
        typedef parser::ReaderState<semantic_state, parser::Reader> state;
        semantic_state ss(std::make_pair(holder(&t), detail::get_helper(t)));
        parser::Reader reader(str, size);
        state st(ss, reader);

        return jsonip::grammar::gram::match(st);
    }